

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void luaK_setlist(FuncState *fs,int base,int nelems,int tostore)

{
  uint uVar1;
  uint i;
  
  i = (nelems + -1) / 0x32 + 1;
  uVar1 = 0;
  if (tostore != -1) {
    uVar1 = tostore << 0x17;
  }
  if (nelems < 0x63cf) {
    i = uVar1 | base << 6 | i * 0x4000 | 0x22;
  }
  else {
    luaK_code(fs,base << 6 | uVar1 | 0x22,fs->ls->lastline);
  }
  luaK_code(fs,i,fs->ls->lastline);
  fs->freereg = base + 1;
  return;
}

Assistant:

void luaK_setlist (FuncState *fs, int base, int nelems, int tostore) {
  int c =  (nelems - 1)/LFIELDS_PER_FLUSH + 1;
  int b = (tostore == LUA_MULTRET) ? 0 : tostore;
  lua_assert(tostore != 0);
  if (c <= MAXARG_C)
    luaK_codeABC(fs, OP_SETLIST, base, b, c);
  else {
    luaK_codeABC(fs, OP_SETLIST, base, b, 0);
    luaK_code(fs, cast(Instruction, c), fs->ls->lastline);
  }
  fs->freereg = base + 1;  /* free registers with list values */
}